

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O3

void Assimp::IFC::ProcessConnectedFaceSet
               (IfcConnectedFaceSet *fset,TempMesh *result,ConversionData *conv)

{
  undefined8 *puVar1;
  IfcFace *pIVar2;
  IfcFaceBound *pIVar3;
  IfcLoop *pIVar4;
  long *plVar5;
  size_type *psVar6;
  undefined8 *puVar7;
  undefined1 auVar8 [16];
  TempMesh meshout;
  allocator local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined8 *local_210;
  TempMesh *local_208;
  undefined8 *local_200;
  TempMesh local_1f8;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = *(undefined8 **)&(fset->super_IfcTopologicalRepresentationItem).field_0x30;
  local_210 = *(undefined8 **)&fset->field_0x38;
  if (local_200 != local_210) {
    local_208 = result;
    do {
      pIVar2 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcFace>((LazyObject *)*local_200);
      local_1f8.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1f8.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1f8.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar1 = *(undefined8 **)&pIVar2->field_0x38;
      for (puVar7 = *(undefined8 **)&(pIVar2->super_IfcTopologicalRepresentationItem).field_0x30;
          puVar7 != puVar1; puVar7 = puVar7 + 1) {
        pIVar3 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcFaceBound>((LazyObject *)*puVar7);
        pIVar4 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcLoop>
                           (*(LazyObject **)
                             &(pIVar3->super_IfcTopologicalRepresentationItem).field_0x30);
        auVar8 = __dynamic_cast((_func_int *)
                                ((long)&(pIVar4->super_IfcTopologicalRepresentationItem).
                                        super_IfcRepresentationItem.
                                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                        ._vptr_ObjectHelper +
                                (long)(pIVar4->super_IfcTopologicalRepresentationItem).
                                      super_IfcRepresentationItem.
                                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                      ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                                &Schema_2x3::IfcPolyLoop::typeinfo,0xffffffffffffffff);
        if (auVar8._0_8_ == (IfcPolyLoop *)0x0) {
          pIVar4 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcLoop>
                             (*(LazyObject **)
                               &(pIVar3->super_IfcTopologicalRepresentationItem).field_0x30);
          std::__cxx11::string::string
                    ((string *)local_1c8,
                     *(char **)(&(pIVar4->super_IfcTopologicalRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 .field_0x10 +
                               (long)(pIVar4->super_IfcTopologicalRepresentationItem).
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     ._vptr_ObjectHelper[-3]),&local_231);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x6df724);
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          psVar6 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_230.field_2._M_allocated_capacity = *psVar6;
            local_230.field_2._8_8_ = plVar5[3];
          }
          else {
            local_230.field_2._M_allocated_capacity = *psVar6;
            local_230._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_230._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>(local_1a8,&local_230);
          LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p);
          }
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0]);
          }
        }
        else {
          ProcessPolyloop(auVar8._0_8_,&local_1f8,auVar8._8_8_);
        }
      }
      ProcessPolygonBoundaries(local_208,&local_1f8,0xffffffffffffffff);
      puVar7 = local_200;
      if (local_1f8.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.mVertcnt.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1f8.mVerts.
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.mVerts.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_200 = puVar7 + 1;
    } while (local_200 != local_210);
  }
  return;
}

Assistant:

void ProcessConnectedFaceSet(const Schema_2x3::IfcConnectedFaceSet& fset, TempMesh& result, ConversionData& conv)
{
    for(const Schema_2x3::IfcFace& face : fset.CfsFaces) {
        // size_t ob = -1, cnt = 0;
        TempMesh meshout;
        for(const Schema_2x3::IfcFaceBound& bound : face.Bounds) {

            if(const Schema_2x3::IfcPolyLoop* const polyloop = bound.Bound->ToPtr<Schema_2x3::IfcPolyLoop>()) {
                if(ProcessPolyloop(*polyloop, meshout,conv)) {

                    // The outer boundary is better determined by checking which
                    // polygon covers the largest area.

                    //if(bound.ToPtr<IfcFaceOuterBound>()) {
                    //  ob = cnt;
                    //}
                    //++cnt;

                }
            }
            else {
                IFCImporter::LogWarn("skipping unknown IfcFaceBound entity, type is " + bound.Bound->GetClassName());
                continue;
            }

            // And this, even though it is sometimes TRUE and sometimes FALSE,
            // does not really improve results.

            /*if(!IsTrue(bound.Orientation)) {
                size_t c = 0;
                for(unsigned int& c : meshout.vertcnt) {
                    std::reverse(result.verts.begin() + cnt,result.verts.begin() + cnt + c);
                    cnt += c;
                }
            }*/
        }
        ProcessPolygonBoundaries(result, meshout);
    }
}